

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

int tcu::getCubeArrayFaceIndex(CubeFace face)

{
  int local_c;
  CubeFace face_local;
  
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    local_c = 1;
    break;
  case CUBEFACE_POSITIVE_X:
    local_c = 0;
    break;
  case CUBEFACE_NEGATIVE_Y:
    local_c = 3;
    break;
  case CUBEFACE_POSITIVE_Y:
    local_c = 2;
    break;
  case CUBEFACE_NEGATIVE_Z:
    local_c = 5;
    break;
  case CUBEFACE_POSITIVE_Z:
    local_c = 4;
    break;
  default:
    local_c = -1;
  }
  return local_c;
}

Assistant:

int getCubeArrayFaceIndex (CubeFace face)
{
	DE_ASSERT((int)face >= 0 && face < CUBEFACE_LAST);

	switch (face)
	{
		case CUBEFACE_POSITIVE_X:	return 0;
		case CUBEFACE_NEGATIVE_X:	return 1;
		case CUBEFACE_POSITIVE_Y:	return 2;
		case CUBEFACE_NEGATIVE_Y:	return 3;
		case CUBEFACE_POSITIVE_Z:	return 4;
		case CUBEFACE_NEGATIVE_Z:	return 5;

		default:
			return -1;
	}
}